

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# offline-ekf-flexibility-estimation.hxx
# Opt level: O2

IndexedVectorArray *
stateObservation::examples::offlineEKFFlexibilityEstimation
          (IndexedVectorArray *__return_storage_ptr__,IndexedVectorArray *y,IndexedVectorArray *u,
          Vector *xh0,uint numberOfContacts,
          vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          *contactsPositions,double dt,IndexedVectorArray *ino,IndexedVectorArray *premea)

{
  undefined4 *puVar1;
  TimeIndex TVar2;
  value_type *__x;
  ulong uVar3;
  long lVar4;
  TimeIndex k;
  MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
  local_62b [3];
  undefined1 local_628 [56];
  Matrix Q;
  double local_5b8;
  Matrix R;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  local_598;
  undefined4 local_578;
  undefined4 uStack_574;
  undefined4 uStack_570;
  undefined4 uStack_56c;
  undefined8 local_568;
  FixedContactEKFFlexEstimatorIMU estimator;
  
  stateObservation::flexibilityEstimation::FixedContactEKFFlexEstimatorIMU::
  FixedContactEKFFlexEstimatorIMU(&estimator,0.005);
  stateObservation::flexibilityEstimation::EKFFlexibilityEstimatorBase::getEKF();
  stateObservation::KalmanFilterBase::getRmatrixIdentity();
  local_598._0_1_ = 0xa0;
  local_598.m_lhs = (LhsNested)0xfeebc2;
  local_598._4_4_ = 0x39b4484b;
  Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
            ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)local_628,(MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&R,(double *)&local_598
            );
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>>
            (&R,(CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                 *)local_628);
  stateObservation::flexibilityEstimation::EKFFlexibilityEstimatorBase::getEKF();
  stateObservation::KalmanFilterBase::getQmatrixIdentity();
  local_598._0_1_ = 0x2d;
  local_598.m_lhs = (LhsNested)0xeb1c43;
  local_598._4_4_ = 0x3f1a36e2;
  Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
            ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)local_628,(MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&Q,(double *)&local_598
            );
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>>
            (&Q,(CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                 *)local_628);
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Identity();
  local_5b8 = 1e-08;
  Eigen::
  MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
  ::operator*(&local_598,local_62b,&local_5b8);
  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>::Block
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)local_628,&Q,6,6,3,3)
  ;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const>>
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)local_628,&local_598)
  ;
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Identity();
  local_5b8 = 1e-08;
  Eigen::
  MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
  ::operator*(&local_598,local_62b,&local_5b8);
  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>::Block
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)local_628,&Q,0xf,0xf,
             3,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const>>
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)local_628,&local_598)
  ;
  stateObservation::flexibilityEstimation::EKFFlexibilityEstimatorBase::setFlexibilityCovariance
            ((Matrix *)&estimator);
  stateObservation::flexibilityEstimation::FixedContactEKFFlexEstimatorIMU::
  setMeasurementNoiseCovariance((Matrix *)&estimator);
  stateObservation::flexibilityEstimation::FixedContactEKFFlexEstimatorIMU::
  setProcessNoiseCovariance((Matrix *)&estimator);
  stateObservation::flexibilityEstimation::FixedContactEKFFlexEstimatorIMU::setContactsNumber
            ((uint)&estimator);
  lVar4 = 0;
  for (uVar3 = 0; numberOfContacts != uVar3; uVar3 = uVar3 + 1) {
    local_568 = *(undefined8 *)(*(long *)contactsPositions + 0x10 + lVar4);
    puVar1 = (undefined4 *)(*(long *)contactsPositions + lVar4);
    local_578 = *puVar1;
    uStack_574 = puVar1[1];
    uStack_570 = puVar1[2];
    uStack_56c = puVar1[3];
    stateObservation::flexibilityEstimation::FixedContactEKFFlexEstimatorIMU::setContactPosition
              (&estimator,uVar3 & 0xffffffff,&local_578);
    lVar4 = lVar4 + 0x18;
  }
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_628,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)xh0);
  stateObservation::flexibilityEstimation::FixedContactEKFFlexEstimatorIMU::setFlexibilityGuess
            ((Matrix *)&estimator);
  free((void *)local_628._0_8_);
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::IndexedMatrixArrayT(__return_storage_ptr__);
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::setValue(__return_storage_ptr__,xh0,y->k_ + -1);
  k = y->k_;
  while( true ) {
    TVar2 = IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
            ::getNextIndex(y);
    if (TVar2 <= k) break;
    IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::operator[]((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)local_628,(TimeIndex)y);
    stateObservation::flexibilityEstimation::FixedContactEKFFlexEstimatorIMU::setMeasurement
              ((Matrix *)&estimator);
    free((void *)local_628._0_8_);
    IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::operator[]((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)local_628,(TimeIndex)u);
    stateObservation::flexibilityEstimation::EKFFlexibilityEstimatorBase::setMeasurementInput
              ((Matrix *)&estimator);
    free((void *)local_628._0_8_);
    __x = (value_type *)
          stateObservation::flexibilityEstimation::FixedContactEKFFlexEstimatorIMU::
          getFlexibilityVector();
    std::
    deque<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::push_back(&__return_storage_ptr__->v_,__x);
    if (ino != (IndexedVectorArray *)0x0) {
      stateObservation::flexibilityEstimation::EKFFlexibilityEstimatorBase::getInnovation();
      IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::setValue(ino,(Matrix<double,__1,_1,_0,__1,_1> *)local_628,k);
      free((void *)local_628._0_8_);
    }
    if (premea != (IndexedVectorArray *)0x0) {
      stateObservation::flexibilityEstimation::EKFFlexibilityEstimatorBase::
      getLastPredictedMeasurement();
      IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::setValue(premea,(Matrix<double,__1,_1,_0,__1,_1> *)local_628,k);
      free((void *)local_628._0_8_);
    }
    k = k + 1;
  }
  free(Q.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(R.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  stateObservation::flexibilityEstimation::FixedContactEKFFlexEstimatorIMU::
  ~FixedContactEKFFlexEstimatorIMU(&estimator);
  return __return_storage_ptr__;
}

Assistant:

stateObservation::IndexedVectorArray offlineEKFFlexibilityEstimation(
            const stateObservation::IndexedVectorArray & y,
            const stateObservation::IndexedVectorArray & u,
            const Vector & xh0,
            unsigned numberOfContacts,
            const std::vector<Vector3,Eigen::aligned_allocator<Vector3> > & contactsPositions,
            double dt,
            IndexedVectorArray * ino,
            IndexedVectorArray * premea)
{

    (void)dt;
        ///Sizes of the states for the state, the measurement, and the input vector

    flexibilityEstimation::FixedContactEKFFlexEstimatorIMU estimator;


    Matrix R(estimator.getEKF().getRmatrixIdentity());
    R=R*1.e-30;

    Matrix Q(estimator.getEKF().getQmatrixIdentity());
    Q=Q*1.e-4;
    Q.block(6,6,3,3)=Matrix3::Identity()*1.e-8;
    Q.block(15,15,3,3)=Matrix3::Identity()*1.e-8;


    estimator.setFlexibilityCovariance(Q);
    estimator.setMeasurementNoiseCovariance(R);
    estimator.setProcessNoiseCovariance(Q);


    estimator.setContactsNumber(numberOfContacts);

    for (unsigned i = 0; i<numberOfContacts ; ++i)
    {
        estimator.setContactPosition(i,contactsPositions[i]);
    }

    ///
    estimator.setFlexibilityGuess(xh0);

    ///the array of the state estimations over time
    stateObservation::IndexedVectorArray xh;
    xh.setValue(xh0,y.getFirstIndex()-1);

    ///the reconstruction of the state
    for (TimeIndex i=y.getFirstIndex();i<y.getNextIndex();++i)
    {
        //std::cout << i << std::endl;

        ///introduction of the measurement
        estimator.setMeasurement(y[i]);

        estimator.setMeasurementInput(u[i]);

        ///get the estimation and give it to the array
        xh.pushBack(estimator.getFlexibilityVector());

        if (ino != 0)
        {
            ino->setValue(estimator.getInnovation(),i);
        }

        if (premea != 0)
        {
            premea->setValue(estimator.getLastPredictedMeasurement(),i);
        }

    }

    return xh;
}